

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O0

shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(string *filename)

{
  bool bVar1;
  runtime_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  shared_ptr<tchecker::parsing::system_declaration_t> sVar2;
  exception *e;
  shared_ptr<tchecker::parsing::system_declaration_t> local_30;
  undefined1 local_19;
  string *local_18;
  string *filename_local;
  shared_ptr<tchecker::parsing::system_declaration_t> *sysdecl;
  
  local_19 = 0;
  local_18 = in_RSI;
  filename_local = filename;
  std::shared_ptr<tchecker::parsing::system_declaration_t>::shared_ptr
            ((shared_ptr<tchecker::parsing::system_declaration_t> *)filename,(nullptr_t)0x0);
  tchecker::parsing::parse_system_declaration((parsing *)&local_30,local_18);
  std::shared_ptr<tchecker::parsing::system_declaration_t>::operator=
            ((shared_ptr<tchecker::parsing::system_declaration_t> *)filename,&local_30);
  std::shared_ptr<tchecker::parsing::system_declaration_t>::~shared_ptr(&local_30);
  bVar1 = std::operator==((shared_ptr<tchecker::parsing::system_declaration_t> *)filename,
                          (nullptr_t)0x0);
  if (bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"nullptr system declaration");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)filename;
  return (shared_ptr<tchecker::parsing::system_declaration_t>)
         sVar2.
         super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::parsing::system_declaration_t> load_system_declaration(std::string const & filename)
{
  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{nullptr};
  try {
    sysdecl = tchecker::parsing::parse_system_declaration(filename);
    if (sysdecl == nullptr)
      throw std::runtime_error("nullptr system declaration");
  }
  catch (std::exception const & e) {
    std::cerr << tchecker::log_error << e.what() << std::endl;
  }
  return sysdecl;
}